

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3BtreeSavepoint(Btree *p,int op,int iSavepoint)

{
  BtShared *pBt_00;
  u32 uVar1;
  BtShared *pBt;
  int rc;
  int iSavepoint_local;
  int op_local;
  Btree *p_local;
  
  pBt._4_4_ = 0;
  if ((p != (Btree *)0x0) && (p->inTrans == '\x02')) {
    pBt_00 = p->pBt;
    sqlite3BtreeEnter(p);
    if (op == 2) {
      pBt._4_4_ = saveAllCursors(pBt_00,0,(BtCursor *)0x0);
    }
    if (pBt._4_4_ == 0) {
      pBt._4_4_ = sqlite3PagerSavepoint(pBt_00->pPager,op,iSavepoint);
    }
    if (pBt._4_4_ == 0) {
      if ((iSavepoint < 0) && ((pBt_00->btsFlags & 0x10) != 0)) {
        pBt_00->nPage = 0;
      }
      pBt._4_4_ = newDatabase(pBt_00);
      uVar1 = sqlite3Get4byte(pBt_00->pPage1->aData + 0x1c);
      pBt_00->nPage = uVar1;
    }
    sqlite3BtreeLeave(p);
  }
  return pBt._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeSavepoint(Btree *p, int op, int iSavepoint){
  int rc = SQLITE_OK;
  if( p && p->inTrans==TRANS_WRITE ){
    BtShared *pBt = p->pBt;
    assert( op==SAVEPOINT_RELEASE || op==SAVEPOINT_ROLLBACK );
    assert( iSavepoint>=0 || (iSavepoint==-1 && op==SAVEPOINT_ROLLBACK) );
    sqlite3BtreeEnter(p);
    if( op==SAVEPOINT_ROLLBACK ){
      rc = saveAllCursors(pBt, 0, 0);
    }
    if( rc==SQLITE_OK ){
      rc = sqlite3PagerSavepoint(pBt->pPager, op, iSavepoint);
    }
    if( rc==SQLITE_OK ){
      if( iSavepoint<0 && (pBt->btsFlags & BTS_INITIALLY_EMPTY)!=0 ){
        pBt->nPage = 0;
      }
      rc = newDatabase(pBt);
      pBt->nPage = get4byte(28 + pBt->pPage1->aData);

      /* The database size was written into the offset 28 of the header
      ** when the transaction started, so we know that the value at offset
      ** 28 is nonzero. */
      assert( pBt->nPage>0 );
    }
    sqlite3BtreeLeave(p);
  }
  return rc;
}